

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O3

void __thiscall Player::Logout(Player *this)

{
  uint uVar1;
  pointer ppCVar2;
  World *pWVar3;
  ulong uVar4;
  pointer ppCVar5;
  IPAddress local_6c;
  string local_68;
  Database_Result local_48;
  
  ppCVar5 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppCVar2 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppCVar5 != ppCVar2) {
    do {
      if (*ppCVar5 != (Character *)0x0) {
        (*((*ppCVar5)->super_Command_Source)._vptr_Command_Source[8])();
      }
      ppCVar5 = ppCVar5 + 1;
    } while (ppCVar5 != ppCVar2);
    ppCVar5 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppCVar5) {
      (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppCVar5;
    }
  }
  if (this->client != (EOClient *)0x0) {
    pWVar3 = this->world;
    uVar4 = time((time_t *)0x0);
    uVar1 = this->client->hdid;
    local_6c = Client::GetRemoteAddr(&this->client->super_Client);
    IPAddress::operator_cast_to_string(&local_68,&local_6c);
    Database::Query(&local_48,&pWVar3->db,
                    "UPDATE `accounts` SET `lastused` = #, `hdid` = #, `lastip` = \'$\' WHERE username = \'$\'"
                    ,uVar4 & 0xffffffff,(ulong)uVar1,local_68._M_dataplus._M_p,
                    (this->username)._M_dataplus._M_p);
    std::
    vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
    ::~vector(&local_48.
               super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
             );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    Client::Close(&this->client->super_Client,false);
    this->client->player = (Player *)0x0;
    this->client = (EOClient *)0x0;
  }
  return;
}

Assistant:

void Player::Logout()
{
	UTIL_FOREACH(this->characters, character)
	{
		delete character;
	}
	this->characters.clear();

	if (this->client)
	{
#ifdef DEBUG
		Console::Dbg("Saving player '%s' (session lasted %i minutes)", this->username.c_str(), int(std::time(0) - this->login_time) / 60);
#endif // DEBUG
		this->world->db.Query("UPDATE `accounts` SET `lastused` = #, `hdid` = #, `lastip` = '$' WHERE username = '$'", int(std::time(0)), this->client->hdid, static_cast<std::string>(this->client->GetRemoteAddr()).c_str(), this->username.c_str());

		// Disconnect the client to make sure this null pointer is never dereferenced
		this->client->Close();
		this->client->player = nullptr;
		this->client = nullptr; // Not reference counted!
	}
}